

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall antlr::Parser::reportError(Parser *this,RecognitionException *ex)

{
  char *pcVar1;
  ostream *this_00;
  long *in_RSI;
  string local_30 [48];
  
  (**(code **)(*in_RSI + 0x10))();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this_00 = std::operator<<((ostream *)&std::cerr,pcVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Parser::reportError(const RecognitionException& ex)
{
	ANTLR_USE_NAMESPACE(std)cerr << ex.toString().c_str() << ANTLR_USE_NAMESPACE(std)endl;
}